

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CastlingRights.h
# Opt level: O2

CastlingRight libchess::CastlingRight::from(char c)

{
  MetaValueType<int> MVar1;
  undefined3 in_register_00000039;
  int iVar2;
  
  iVar2 = CONCAT31(in_register_00000039,c);
  if (iVar2 == 0x4b) {
    MVar1.value_ = 1;
  }
  else if (iVar2 == 0x71) {
    MVar1.value_ = 8;
  }
  else if (iVar2 == 0x6b) {
    MVar1.value_ = 4;
  }
  else {
    if (iVar2 != 0x51) {
      return (MetaValueType<int>)0;
    }
    MVar1.value_ = 2;
  }
  return (MetaValueType<int>)(MetaValueType<int>)MVar1.value_;
}

Assistant:

constexpr static CastlingRight from(char c) {
        switch (c) {
        case 'K':
            return CastlingRight{Value::WHITE_KINGSIDE};
        case 'Q':
            return CastlingRight{Value::WHITE_QUEENSIDE};
        case 'k':
            return CastlingRight{Value::BLACK_KINGSIDE};
        case 'q':
            return CastlingRight{Value::BLACK_QUEENSIDE};
        default:
            return CastlingRight{Value::CASTLING_RIGHT_NONE};
        }
    }